

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::EndTestCase
          (XmlReporter *this,TestCaseInfo *param_2,Totals *param_3,string *param_4,string *param_5)

{
  string *this_00;
  string *in_RDI;
  allocator *this_01;
  string *in_stack_ffffffffffffff70;
  XmlWriter *in_stack_ffffffffffffff78;
  XmlWriter *in_stack_ffffffffffffff80;
  allocator local_51;
  string local_50 [80];
  
  this_00 = in_RDI + 0x28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"OverallResult",&local_51);
  XmlWriter::scopedElement(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  this_01 = (allocator *)&stack0xffffffffffffff77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff78,"success",this_01);
  XmlWriter::ScopedElement::writeAttribute<bool>((ScopedElement *)this_00,in_RDI,(bool *)this_01);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_01);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  XmlWriter::endElement(in_stack_ffffffffffffff80);
  return;
}

Assistant:

virtual void EndTestCase( const Catch::TestCaseInfo&, const Totals&, const std::string&, const std::string& ) {
            m_xml.scopedElement( "OverallResult" ).writeAttribute( "success", m_currentTestSuccess );
            m_xml.endElement();
        }